

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

mg_dns_resource_record *
mg_dns_next_record(mg_dns_message *msg,int query,mg_dns_resource_record *prev)

{
  mg_dns_resource_record *pmVar1;
  long lVar2;
  
  pmVar1 = prev + 1;
  if (prev == (mg_dns_resource_record *)0x0) {
    pmVar1 = msg->answers;
  }
  lVar2 = (long)pmVar1 + (-0x620 - (long)msg);
  while( true ) {
    if ((long)msg->num_answers <= lVar2 / 0x30) {
      return (mg_dns_resource_record *)0x0;
    }
    if (pmVar1->rtype == query) break;
    pmVar1 = pmVar1 + 1;
    lVar2 = lVar2 + 0x30;
  }
  return pmVar1;
}

Assistant:

struct mg_dns_resource_record *mg_dns_next_record(
        struct mg_dns_message *msg, int query,
        struct mg_dns_resource_record *prev) {
    struct mg_dns_resource_record *rr;

    for (rr = (prev == NULL ? msg->answers : prev + 1);
         rr - msg->answers < msg->num_answers; rr++) {
        if (rr->rtype == query) {
            return rr;
        }
    }
    return NULL;
}